

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::QGraphicsSceneBspTreeIndexPrivate
          (QGraphicsSceneBspTreeIndexPrivate *this,QGraphicsScene *scene)

{
  QGraphicsSceneIndexPrivate *in_RSI;
  QGraphicsScene *in_RDI;
  
  QGraphicsSceneIndexPrivate::QGraphicsSceneIndexPrivate(in_RSI,in_RDI);
  *(undefined ***)in_RDI = &PTR__QGraphicsSceneBspTreeIndexPrivate_00d348b0;
  QGraphicsSceneBspTree::QGraphicsSceneBspTree((QGraphicsSceneBspTree *)in_RSI);
  QRectF::QRectF((QRectF *)&in_RDI[0xd].field_0x8);
  *(undefined4 *)&in_RDI[0xf].field_0x8 = 0;
  QBasicTimer::QBasicTimer((QBasicTimer *)&in_RDI[0xf].field_0xc);
  in_RDI[0x10].super_QObject = (QObject)0x0;
  in_RDI[0x10].field_0x1 = 1;
  *(undefined4 *)&in_RDI[0x10].field_0x4 = 0;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa1db75);
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa1db85);
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa1db95);
  QList<int>::QList((QList<int> *)0xa1dba5);
  in_RDI[0x16].field_0x8 = 0;
  QSet<QGraphicsItem_*>::QSet((QSet<QGraphicsItem_*> *)0xa1dbbc);
  in_RDI[0x17].field_0x8 = 0;
  in_RDI[0x17].field_0x9 = 0;
  return;
}

Assistant:

QGraphicsSceneBspTreeIndexPrivate::QGraphicsSceneBspTreeIndexPrivate(QGraphicsScene *scene)
    : QGraphicsSceneIndexPrivate(scene),
    bspTreeDepth(0),
    restartIndexTimer(false),
    regenerateIndex(true),
    lastItemCount(0),
    purgePending(false),
    sortCacheEnabled(false),
    updatingSortCache(false)
{
}